

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

InplaceStr GetTypeConstructorName(InplaceStr functionName)

{
  char *pcVar1;
  char *strEnd;
  char *pcVar2;
  InplaceStr IVar3;
  InplaceStr local_18;
  
  strEnd = functionName.end;
  pcVar2 = strEnd;
  do {
    pcVar1 = functionName.begin;
    if (pcVar2 <= functionName.begin) {
LAB_0015f291:
      IVar3.end = strEnd;
      IVar3.begin = pcVar1;
      return IVar3;
    }
    if (*pcVar2 == '.') {
      InplaceStr::InplaceStr(&local_18,pcVar2 + 1,strEnd);
      pcVar1 = local_18.begin;
      strEnd = local_18.end;
      goto LAB_0015f291;
    }
    pcVar2 = pcVar2 + -1;
  } while( true );
}

Assistant:

InplaceStr GetTypeConstructorName(InplaceStr functionName)
{
	// TODO: add type scopes and lookup owner namespace
	for(const char *pos = functionName.end; pos > functionName.begin; pos--)
	{
		if(*pos == '.')
		{
			functionName = InplaceStr(pos + 1, functionName.end);
			break;
		}
	}

	return functionName;
}